

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O2

bool btGeneric6DofSpring2Constraint::matrixToEulerYXZ(btMatrix3x3 *mat,btVector3 *xyz)

{
  bool bVar1;
  btScalar bVar2;
  float fVar3;
  
  fVar3 = mat->m_el[2].m_floats[1];
  if (1.0 <= fVar3) {
    xyz->m_floats[0] = -1.5707964;
    bVar2 = atan2f(-mat->m_el[1].m_floats[0],mat->m_el[0].m_floats[0]);
  }
  else {
    if (-1.0 < fVar3) {
      bVar2 = btAsin(-fVar3);
      xyz->m_floats[0] = bVar2;
      fVar3 = atan2f(mat->m_el[2].m_floats[0],mat->m_el[2].m_floats[2]);
      xyz->m_floats[1] = fVar3;
      bVar2 = atan2f(mat->m_el[0].m_floats[1],mat->m_el[1].m_floats[1]);
      bVar1 = true;
      goto LAB_00171bcb;
    }
    xyz->m_floats[0] = 1.5707964;
    fVar3 = atan2f(-mat->m_el[1].m_floats[0],mat->m_el[0].m_floats[0]);
    bVar2 = -fVar3;
  }
  xyz->m_floats[1] = bVar2;
  bVar2 = 0.0;
  bVar1 = false;
LAB_00171bcb:
  xyz->m_floats[2] = bVar2;
  return bVar1;
}

Assistant:

bool btGeneric6DofSpring2Constraint::matrixToEulerYXZ(const btMatrix3x3& mat,btVector3& xyz)
{
	// rot =  cy*cz+sy*sx*sz  cz*sy*sx-cy*sz  cx*sy
	//        cx*sz           cx*cz           -sx
	//        cy*sx*sz-cz*sy  sy*sz+cy*cz*sx  cy*cx

	btScalar fi = btGetMatrixElem(mat,5);
	if (fi < btScalar(1.0f))
	{
		if (fi > btScalar(-1.0f))
		{
			xyz[0] = btAsin(-btGetMatrixElem(mat,5));
			xyz[1] = btAtan2(btGetMatrixElem(mat,2),btGetMatrixElem(mat,8));
			xyz[2] = btAtan2(btGetMatrixElem(mat,3),btGetMatrixElem(mat,4));
			return true;
		}
		else
		{
			xyz[0] = SIMD_HALF_PI;
			xyz[1] = -btAtan2(-btGetMatrixElem(mat,1),btGetMatrixElem(mat,0));
			xyz[2] = btScalar(0.0);
			return false;
		}
	}
	else
	{
		xyz[0] = -SIMD_HALF_PI;
		xyz[1] = btAtan2(-btGetMatrixElem(mat,1),btGetMatrixElem(mat,0));
		xyz[2] = 0.0;
	}
	return false;
}